

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ZSTD_longLengthType_e ZVar4;
  seqDef *psVar5;
  ZSTD_Sequence *pZVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  repcodes_t rVar13;
  U32 local_68 [3];
  ulong local_58;
  BYTE *local_50;
  size_t local_48;
  ZSTD_Sequence *local_40;
  BYTE *local_38;
  
  psVar5 = (zc->seqStore).sequencesStart;
  local_58 = (long)(zc->seqStore).sequences - (long)psVar5 >> 3;
  local_38 = (zc->seqStore).lit;
  local_50 = (zc->seqStore).litStart;
  pZVar6 = (zc->seqCollector).seqStart;
  local_48 = (zc->seqCollector).seqIndex;
  local_40 = pZVar6 + local_48;
  local_68 = *&((zc->blockState).prevCBlock)->rep;
  puVar10 = &pZVar6[local_48].rep;
  iVar9 = 0;
  for (uVar11 = 0; local_58 != uVar11; uVar11 = uVar11 + 1) {
    uVar3 = psVar5[uVar11].offset;
    uVar1 = psVar5[uVar11].litLength;
    uVar7 = (uint)uVar1;
    puVar10[-2] = (uint)uVar1;
    uVar2 = psVar5[uVar11].matchLength;
    puVar10[-1] = uVar2 + 3;
    *puVar10 = 0;
    uVar12 = (uint)uVar1;
    if (uVar11 == (zc->seqStore).longLengthPos) {
      ZVar4 = (zc->seqStore).longLengthType;
      uVar12 = uVar7;
      if (ZVar4 == ZSTD_llt_matchLength) {
        puVar10[-1] = uVar2 + 0x10003;
      }
      else if (ZVar4 == ZSTD_llt_literalLength) {
        puVar10[-2] = uVar7 + 0x10000;
        uVar12 = uVar7 + 0x10000;
      }
    }
    if (uVar3 < 4) {
      *puVar10 = uVar3;
      if (uVar12 == 0) {
        if (uVar3 == 3) {
          uVar8 = local_68[0] - 1;
        }
        else {
          uVar8 = local_68[uVar3];
        }
      }
      else {
        uVar8 = local_68[uVar3 - 1];
      }
    }
    else {
      uVar8 = uVar3 - 3;
    }
    ((ZSTD_Sequence *)(puVar10 + -3))->offset = uVar8;
    rVar13 = ZSTD_updateRep(local_68,uVar3 - 1,(uint)(uVar7 == 0));
    local_68[0] = rVar13.rep[0];
    local_68[1] = rVar13.rep[1];
    local_68[2] = rVar13.rep[2];
    iVar9 = iVar9 + uVar12;
    puVar10 = puVar10 + 4;
  }
  local_40[local_58].litLength = (int)local_38 - (iVar9 + (int)local_50);
  local_40[local_58].offset = 0;
  local_40[local_58].matchLength = 0;
  local_40[local_58].rep = 0;
  (zc->seqCollector).seqIndex = local_48 + local_58 + 1;
  return;
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offset - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].matchLength + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offset <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offset;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep,
                                         seqStoreSeqs[i].offset - 1,
                                         seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}